

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O3

int main(void)

{
  thread consThr;
  thread prodThr;
  thread local_20;
  thread local_18;
  _func_void *local_10;
  
  local_20._M_id._M_thread = (id)produce;
  local_10 = (_func_void *)CONCAT44(local_10._4_4_,10);
  std::thread::thread<void(*)(int),int,void>
            (&local_18,(_func_void_int **)&local_20,(int *)&local_10);
  local_10 = consume;
  std::thread::thread<void(*)(),,void>(&local_20,&local_10);
  std::thread::join();
  std::thread::join();
  if ((local_20._M_id._M_thread == 0) && (local_18._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main() {
    // Run `produce` function on a new thread providing a function argument
    std::thread prodThr(&produce, 10);
    // Run `consume` function on a new thread
    std::thread consThr(&consume);

    // Wait for the threads to terminate before exiting the main function
    prodThr.join();
    consThr.join();

    return 0;
}